

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O3

void Ssc_ManCollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  
  iVar3 = 1;
  if (((ulong)pObj & 1) == 0) {
    uVar1 = *(uint *)pObj;
    while (((uVar1 & 0x9fffffff) != 0x9fffffff && (iVar3 = Gia_ObjIsMuxType(pObj), iVar3 == 0))) {
      Ssc_ManCollectSuper_rec
                (p,(Gia_Obj_t *)
                   ((ulong)((uint)(*(ulong *)pObj >> 0x1d) & 1) ^
                   (ulong)(pObj + -(*(ulong *)pObj & 0x1fffffff))),vSuper);
      pObj = (Gia_Obj_t *)
             ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) ^
             (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)));
      if (((ulong)pObj & 1) != 0) {
        iVar3 = 1;
        goto LAB_00643e3d;
      }
      uVar1 = *(uint *)pObj;
    }
    iVar3 = 0;
  }
LAB_00643e3d:
  pGVar6 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pGVar6) && (pGVar6 < pGVar2 + p->nObjs)) {
    iVar5 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2);
    if (iVar5 * -0x55555555 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    iVar3 = iVar3 + iVar5 * 0x55555556;
    if (0 < (long)vSuper->nSize) {
      lVar4 = 0;
      do {
        if (vSuper->pArray[lVar4] == iVar3) {
          return;
        }
        lVar4 = lVar4 + 1;
      } while (vSuper->nSize != lVar4);
    }
    Vec_IntPush(vSuper,iVar3);
    return;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static void Ssc_ManCollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    // stop at complements, PIs, and MUXes
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || Gia_ObjIsMuxType(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_Obj2Lit(p, pObj) );
        return;
    }
    Ssc_ManCollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper );
    Ssc_ManCollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper );
}